

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

uint8_t * __thiscall Lodtalk::VMHeap::allocate(VMHeap *this,size_t objectSize)

{
  ulong offset;
  bool bVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = objectSize + this->size;
  offset = this->capacity;
  puVar2 = this->addressSpace + this->size;
  if (offset < uVar4) {
    uVar3 = -this->pageSize & (uVar4 + this->pageSize) - 1;
    bVar1 = allocateVirtualAddressRegion(this->addressSpace,offset,uVar3 - offset);
    if (bVar1) {
      this->size = uVar4;
      this->capacity = uVar3;
    }
    else {
      puVar2 = (uint8_t *)0x0;
    }
  }
  else {
    this->size = uVar4;
  }
  return puVar2;
}

Assistant:

uint8_t *VMHeap::allocate(size_t objectSize)
{
    size_t newHeapSize = size + objectSize;
    auto result = addressSpace + size;

    // Check the current capacity
    if(newHeapSize <= capacity)
    {
        size = newHeapSize;
        return result;
    }

    // Compute the new capacity
    auto newCapacity = (newHeapSize + pageSize - 1) & (~ (pageSize - 1));
    if(!allocateVirtualAddressRegion(addressSpace, capacity, newCapacity - capacity))
        return nullptr;

    // Store the new capacity and sizes
    //printf("vm heap %zu %zu\n", newHeapSize, newCapacity);
    size = newHeapSize;
    capacity = newCapacity;
    return result;
}